

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

QIcon __thiscall
QFusionStyle::standardIcon
          (QFusionStyle *this,StandardPixmap standardIcon,QStyleOption *option,QWidget *widget)

{
  long in_FS_OFFSET;
  QIcon icon;
  QArrayData *local_58 [2];
  long local_48;
  QFusionStyle local_40;
  
  local_40.super_QCommonStyle.super_QStyle._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_40.super_QCommonStyle.super_QStyle._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  iconFromTheme(&local_40,standardIcon);
  QIcon::availableSizes((Mode)local_58,(State)&local_40);
  if (local_58[0] != (QArrayData *)0x0) {
    LOCK();
    (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58[0],8,0x10);
    }
  }
  if (local_48 == 0) {
    QCommonStyle::standardIcon
              (&this->super_QCommonStyle,standardIcon,(QStyleOption *)((ulong)option & 0xffffffff),
               widget);
  }
  else {
    QIcon::QIcon((QIcon *)this,(QIcon *)&local_40);
  }
  QIcon::~QIcon((QIcon *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_40.super_QCommonStyle.super_QStyle._8_8_) {
    return (QIcon)(QIconPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QIcon QFusionStyle::standardIcon(StandardPixmap standardIcon, const QStyleOption *option,
                                 const QWidget *widget) const
{
    const auto icon = iconFromTheme(standardIcon);
    if (!icon.availableSizes().isEmpty())
        return icon;
    return QCommonStyle::standardIcon(standardIcon, option, widget);
}